

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_sfx.c
# Opt level: O3

void test_read_format_zip_sfx(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  char *buff;
  archive *a;
  char *pcVar4;
  la_int64_t v2;
  archive_entry *ae;
  size_t s;
  archive_entry *local_40;
  size_t local_38;
  
  extract_reference_file("test_read_format_zip_sfx");
  buff = slurpfile(&local_38,"%s","test_read_format_zip_sfx");
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                   ,L'*',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  wVar1 = archive_read_support_format_zip(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'+',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip(a)",a);
  iVar2 = read_open_memory_seek(a,buff,local_38,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_seek(a, p, s, 1)",a);
  iVar2 = archive_read_next_header(a,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_40);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
             ,L'/',"file0","\"file0\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'0',0x81a4,"AE_IFREG | 0644",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  wVar1 = archive_entry_is_encrypted(local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'1',(long)wVar1,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar2 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'2',(long)iVar2,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar2 = archive_read_next_header(a,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'4',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_40);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
             ,L'5',"build.sh","\"build.sh\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'6',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2 = archive_entry_size(local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'7',0x17,"23",v2,"archive_entry_size(ae)",(void *)0x0);
  wVar1 = archive_entry_is_encrypted(local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'8',(long)wVar1,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar2 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'9',(long)iVar2,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar2 = archive_read_next_header(a,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L';',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  iVar2 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
  iVar2 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_sfx.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",a);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_sfx)
{
	const char *refname = "test_read_format_zip_sfx";
	char *p;
	size_t s;
	struct archive *a;
	struct archive_entry *ae;

	extract_reference_file(refname);
	p = slurpfile(&s, "%s", refname);

	/* Symlinks can only be extracted with the seeking reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 1));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file0", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("build.sh", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(23, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(p);
}